

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall ot::commissioner::coap::Coap::RequestsCache::UpdateTimer(RequestsCache *this)

{
  bool bVar1;
  
  bVar1 = (this->mRetransmissionTimer).mEnabled;
  if ((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (bVar1 != false) {
      event_del((event *)this);
    }
    (this->mRetransmissionTimer).mEnabled = false;
  }
  else if ((bVar1 == false) ||
          (*(long *)((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 3) <
           (this->mRetransmissionTimer).mFireTime.__d.__r)) {
    Timer::Start(&this->mRetransmissionTimer,
                 (duration)
                 *(duration *)
                  ((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 3));
    return;
  }
  return;
}

Assistant:

void Coap::RequestsCache::UpdateTimer()
{
    if (IsEmpty())
    {
        mRetransmissionTimer.Stop();
    }
    else if (!mRetransmissionTimer.IsRunning() || Earliest() < mRetransmissionTimer.GetFireTime())
    {
        mRetransmissionTimer.Start(Earliest());
    }
}